

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManHasMarks(If_DsdMan_t *p)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(p->vObjs).nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((*(byte *)((long)(p->vObjs).pArray[lVar2] + 5) & 1) != 0) {
        return 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return 0;
}

Assistant:

int If_DsdManHasMarks( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    int i;
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( pObj->fMark )
            return 1;
    return 0;
}